

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

MemberSyntax * __thiscall
slang::parsing::Parser::parseClockingDeclaration(Parser *this,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token edge;
  Token edge_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_00;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> elements_01;
  Token clocking_00;
  Token defaultKeyword;
  Token clocking_01;
  Token name;
  Token globalOrDefault_00;
  Token semi_00;
  SourceLocation location;
  SourceLocation location_00;
  Token blockName_00;
  Token at_00;
  Token semi_01;
  bool bVar1;
  NamedBlockClauseSyntax *pNVar2;
  undefined8 *in_RDI;
  Token TVar3;
  NamedBlockClauseSyntax *endBlockName;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> members;
  Token endClocking;
  Token semi;
  EventExpressionSyntax *event;
  Token at;
  Token blockName;
  Token clocking;
  Token globalOrDefault;
  ParserBase *in_stack_fffffffffffffc68;
  Parser *in_stack_fffffffffffffc70;
  undefined6 in_stack_fffffffffffffc78;
  TokenKind in_stack_fffffffffffffc7e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  ParserBase *in_stack_fffffffffffffc90;
  NamedBlockClauseSyntax *in_stack_fffffffffffffc98;
  Parser *in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffca8;
  Info *in_stack_fffffffffffffcb0;
  Info *in_stack_fffffffffffffcb8;
  undefined8 in_stack_fffffffffffffcc0;
  Info *pIVar4;
  Parser *in_stack_fffffffffffffcc8;
  ParserBase *in_stack_fffffffffffffcd0;
  undefined7 in_stack_fffffffffffffcd8;
  undefined1 uVar5;
  undefined4 in_stack_fffffffffffffce0;
  DiagCode in_stack_fffffffffffffce4;
  Info *in_stack_fffffffffffffce8;
  TokenKind in_stack_fffffffffffffcfe;
  ParserBase *in_stack_fffffffffffffd00;
  pointer ppMVar6;
  __extent_storage<18446744073709551615UL> _Var7;
  SyntaxFactory in_stack_fffffffffffffd18;
  Token in_stack_fffffffffffffd20;
  NamedBlockClauseSyntax *in_stack_fffffffffffffd30;
  Parser *in_stack_fffffffffffffd80;
  Token local_200;
  SourceLocation local_1f0;
  undefined4 local_1e4;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> local_1d8;
  undefined8 local_1c8;
  Info *local_1c0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_00;
  SyntaxKind in_stack_fffffffffffffe5c;
  Token *in_stack_fffffffffffffe60;
  TokenKind in_stack_fffffffffffffe6e;
  Parser *in_stack_fffffffffffffe70;
  Token local_168;
  SourceLocation local_158;
  undefined4 local_14c;
  string_view local_148;
  Token local_138;
  SourceLocation local_128;
  Token local_120;
  Token local_110;
  undefined8 local_100;
  Info *local_f8;
  Parser *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  bitmask<slang::parsing::detail::ExpressionOptions> options;
  undefined8 in_stack_ffffffffffffff30;
  TokenKind kind;
  BumpAllocator *in_stack_ffffffffffffff38;
  SourceLocation in_stack_ffffffffffffff40;
  undefined8 local_88;
  Info *local_80;
  TokenKind local_58;
  ClockingDeclarationSyntax *local_30;
  
  options.m_bits = (underlying_type)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  kind = (TokenKind)((ulong)in_stack_ffffffffffffff30 >> 0x30);
  Token::Token((Token *)in_stack_fffffffffffffc70);
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffc80._M_extent_value,
                           in_stack_fffffffffffffc7e);
  if (!bVar1) {
    TVar3 = ParserBase::consume(in_stack_fffffffffffffc90);
    local_58 = TVar3.kind;
  }
  ParserBase::expect(in_stack_fffffffffffffd00,in_stack_fffffffffffffcfe);
  TVar3 = ParserBase::consumeIf
                    (&in_stack_fffffffffffffc70->super_ParserBase,
                     (TokenKind)((ulong)in_stack_fffffffffffffc68 >> 0x30));
  local_80 = TVar3.info;
  if (((local_58 == DefaultKeyword) &&
      (bVar1 = Token::operator_cast_to_bool((Token *)0xc0a019), bVar1)) &&
     (bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffc80._M_extent_value,
                               in_stack_fffffffffffffc7e), bVar1)) {
    elements._M_ptr._6_2_ = in_stack_fffffffffffffc7e;
    elements._M_ptr._0_6_ = in_stack_fffffffffffffc78;
    elements._M_extent._M_extent_value = in_stack_fffffffffffffc80._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffc70,
               elements);
    local_88 = TVar3._0_8_;
    local_100 = local_88;
    local_f8 = local_80;
    local_110 = ParserBase::consume(in_stack_fffffffffffffc90);
    defaultKeyword.info = (Info *)in_stack_fffffffffffffca0;
    defaultKeyword._0_8_ = in_stack_fffffffffffffc98;
    clocking_00.info = (Info *)in_stack_fffffffffffffc90;
    clocking_00.kind = (short)in_stack_fffffffffffffc88;
    clocking_00._2_1_ = (char)((ulong)in_stack_fffffffffffffc88 >> 0x10);
    clocking_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffc88 >> 0x18);
    clocking_00.rawLen = (int)((ulong)in_stack_fffffffffffffc88 >> 0x20);
    name.info = in_stack_fffffffffffffcb8;
    name._0_8_ = in_stack_fffffffffffffcb0;
    semi_00.info = (Info *)in_stack_fffffffffffffcc8;
    semi_00.kind = (short)in_stack_fffffffffffffcc0;
    semi_00._2_1_ = (char)((ulong)in_stack_fffffffffffffcc0 >> 0x10);
    semi_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffcc0 >> 0x18);
    semi_00.rawLen = (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20);
    local_30 = (ClockingDeclarationSyntax *)
               slang::syntax::SyntaxFactory::defaultClockingReference
                         ((SyntaxFactory *)local_110.info,
                          (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_110._0_8_,
                          defaultKeyword,clocking_00,name,semi_00);
  }
  else {
    bVar1 = Token::operator_cast_to_bool((Token *)0xc0a18d);
    if (!bVar1) {
      in_stack_fffffffffffffce0 = (undefined4)*in_RDI;
      in_stack_fffffffffffffce4 = SUB84((ulong)*in_RDI >> 0x20,0);
      local_138 = ParserBase::peek(in_stack_fffffffffffffc68);
      local_128 = Token::location(&local_138);
      local_120 = Token::createMissing(in_stack_ffffffffffffff38,kind,in_stack_ffffffffffffff40);
    }
    bVar1 = Token::operator_cast_to_bool((Token *)0xc0a223);
    uVar5 = false;
    if (!bVar1) {
      local_148 = Token::valueText((Token *)in_stack_fffffffffffffc80._M_extent_value);
      uVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_148);
    }
    if ((bool)uVar5 != false) {
      local_14c = 0x90005;
      local_168 = ParserBase::peek(in_stack_fffffffffffffc68);
      local_158 = Token::location(&local_168);
      location._7_1_ = uVar5;
      location._0_7_ = in_stack_fffffffffffffcd8;
      ParserBase::addDiag(in_stack_fffffffffffffcd0,in_stack_fffffffffffffce4,location);
    }
    ParserBase::expect(in_stack_fffffffffffffd00,in_stack_fffffffffffffcfe);
    bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffc80._M_extent_value,
                             in_stack_fffffffffffffc7e);
    if (bVar1) {
      parseEventExpression(in_stack_fffffffffffffd80);
    }
    else {
      bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffc80._M_extent_value,
                               in_stack_fffffffffffffc7e);
      if (bVar1) {
        in_stack_fffffffffffffcd0 = (ParserBase *)(in_RDI + 0x1c);
        Token::Token((Token *)in_stack_fffffffffffffc70);
        bitmask<slang::parsing::detail::ExpressionOptions>::bitmask
                  ((bitmask<slang::parsing::detail::ExpressionOptions> *)&stack0xfffffffffffffe6c,
                   None);
        parsePrimaryExpression(in_stack_ffffffffffffff10,options);
        edge.rawLen._2_2_ = in_stack_fffffffffffffc7e;
        edge._0_6_ = in_stack_fffffffffffffc78;
        edge.info = (Info *)in_stack_fffffffffffffc80._M_extent_value;
        slang::syntax::SyntaxFactory::signalEventExpression
                  ((SyntaxFactory *)in_stack_fffffffffffffc70,edge,
                   (ExpressionSyntax *)in_stack_fffffffffffffc68,(IffEventClauseSyntax *)0xc0a394);
      }
      else {
        in_stack_fffffffffffffcc8 = (Parser *)(in_RDI + 0x1c);
        Token::Token((Token *)in_stack_fffffffffffffc70);
        parseName(in_stack_fffffffffffffc70);
        edge_00.rawLen._2_2_ = in_stack_fffffffffffffc7e;
        edge_00._0_6_ = in_stack_fffffffffffffc78;
        edge_00.info = (Info *)in_stack_fffffffffffffc80._M_extent_value;
        slang::syntax::SyntaxFactory::signalEventExpression
                  ((SyntaxFactory *)in_stack_fffffffffffffc70,edge_00,
                   (ExpressionSyntax *)in_stack_fffffffffffffc68,(IffEventClauseSyntax *)0xc0a3ed);
      }
    }
    TVar3 = ParserBase::expect(in_stack_fffffffffffffd00,in_stack_fffffffffffffcfe);
    attributes_00 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar3.info;
    Token::Token((Token *)in_stack_fffffffffffffc70);
    local_1d8 = parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseClockingDeclaration(std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>)::__0>
                          (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6e,
                           in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                           (anon_class_8_1_8991fb9c *)attributes_00);
    if ((local_58 == GlobalKeyword) &&
       (bVar1 = std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::empty
                          ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)0xc0a47e),
       !bVar1)) {
      local_1e4 = 0x5d0005;
      std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::operator[](&local_1d8,0);
      local_200 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_fffffffffffffca0);
      local_1f0 = Token::location(&local_200);
      location_00._7_1_ = uVar5;
      location_00._0_7_ = in_stack_fffffffffffffcd8;
      ParserBase::addDiag(in_stack_fffffffffffffcd0,in_stack_fffffffffffffce4,location_00);
    }
    pNVar2 = parseNamedBlockClause(in_stack_fffffffffffffcc8);
    TVar3.info = in_stack_fffffffffffffcb0;
    TVar3.kind = (short)in_stack_fffffffffffffca8;
    TVar3._2_1_ = (char)((ulong)in_stack_fffffffffffffca8 >> 0x10);
    TVar3.numFlags.raw = (char)((ulong)in_stack_fffffffffffffca8 >> 0x18);
    TVar3.rawLen = (int)((ulong)in_stack_fffffffffffffca8 >> 0x20);
    checkBlockNames(in_stack_fffffffffffffca0,TVar3,in_stack_fffffffffffffc98);
    pIVar4 = (Info *)(in_RDI + 0x1c);
    elements_00._M_ptr._6_2_ = in_stack_fffffffffffffc7e;
    elements_00._M_ptr._0_6_ = in_stack_fffffffffffffc78;
    elements_00._M_extent._M_extent_value = in_stack_fffffffffffffc80._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffc70,
               elements_00);
    elements_01._M_ptr._6_2_ = in_stack_fffffffffffffc7e;
    elements_01._M_ptr._0_6_ = in_stack_fffffffffffffc78;
    elements_01._M_extent._M_extent_value = in_stack_fffffffffffffc80._M_extent_value;
    ppMVar6 = local_1d8._M_ptr;
    _Var7._M_extent_value = local_1d8._M_extent._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::MemberSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::MemberSyntax> *)in_stack_fffffffffffffc70,elements_01);
    globalOrDefault_00.info = pIVar4;
    globalOrDefault_00._0_8_ = pNVar2;
    clocking_01.info = local_1c0;
    clocking_01.kind = (undefined2)local_1c8;
    clocking_01._2_1_ = local_1c8._2_1_;
    clocking_01.numFlags.raw = local_1c8._3_1_;
    clocking_01.rawLen = local_1c8._4_4_;
    blockName_00.rawLen._0_2_ = in_stack_fffffffffffffce4.subsystem;
    blockName_00.rawLen._2_2_ = in_stack_fffffffffffffce4.code;
    blockName_00.kind = (short)in_stack_fffffffffffffce0;
    blockName_00._2_1_ = (char)((uint)in_stack_fffffffffffffce0 >> 0x10);
    blockName_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffce0 >> 0x18);
    blockName_00.info = in_stack_fffffffffffffce8;
    at_00.info._0_6_ = (int6)local_1c8;
    at_00._0_8_ = in_RDI;
    at_00.info._6_2_ = (short)((ulong)local_1c8 >> 0x30);
    semi_01.info = (Info *)_Var7._M_extent_value;
    semi_01._0_8_ = ppMVar6;
    local_30 = slang::syntax::SyntaxFactory::clockingDeclaration
                         ((SyntaxFactory *)&stack0xfffffffffffffd18,attributes_00,globalOrDefault_00
                          ,clocking_01,blockName_00,at_00,(EventExpressionSyntax *)local_1c0,semi_01
                          ,(SyntaxList<slang::syntax::MemberSyntax> *)
                           in_stack_fffffffffffffd18.alloc,in_stack_fffffffffffffd20,
                          in_stack_fffffffffffffd30);
  }
  return &local_30->super_MemberSyntax;
}

Assistant:

MemberSyntax& Parser::parseClockingDeclaration(AttrList attributes) {
    Token globalOrDefault;
    if (!peek(TokenKind::ClockingKeyword))
        globalOrDefault = consume();

    Token clocking = expect(TokenKind::ClockingKeyword);
    Token blockName = consumeIf(TokenKind::Identifier);

    // If this is a default reference there is no body to parse.
    if (globalOrDefault.kind == TokenKind::DefaultKeyword && blockName &&
        peek(TokenKind::Semicolon)) {
        return factory.defaultClockingReference(attributes, globalOrDefault, clocking, blockName,
                                                consume());
    }

    if (!blockName)
        blockName = Token::createMissing(alloc, TokenKind::Identifier, peek().location());

    if (!globalOrDefault && blockName.valueText().empty())
        addDiag(diag::ClockingNameEmpty, peek().location());

    Token at = expect(TokenKind::At);

    EventExpressionSyntax* event;
    if (peek(TokenKind::OpenParenthesis)) {
        event = &parseEventExpression();
    }
    else if (peek(TokenKind::SystemIdentifier)) {
        event = &factory.signalEventExpression({}, parsePrimaryExpression(ExpressionOptions::None),
                                               nullptr);
    }
    else {
        event = &factory.signalEventExpression({}, parseName(), nullptr);
    }

    Token semi = expect(TokenKind::Semicolon);
    Token endClocking;
    auto members = parseMemberList<MemberSyntax>(
        TokenKind::EndClockingKeyword, endClocking, SyntaxKind::ClockingDeclaration,
        [this](SyntaxKind, bool&) { return parseClockingItem(); });

    if (globalOrDefault.kind == TokenKind::GlobalKeyword && !members.empty())
        addDiag(diag::GlobalClockingEmpty, members[0]->getFirstToken().location());

    NamedBlockClauseSyntax* endBlockName = parseNamedBlockClause();
    checkBlockNames(blockName, endBlockName);

    return factory.clockingDeclaration(attributes, globalOrDefault, clocking, blockName, at, *event,
                                       semi, members, endClocking, endBlockName);
}